

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segmentation.c
# Opt level: O0

void av1_reset_segment_features(AV1_COMMON *cm)

{
  long in_RDI;
  segmentation *seg;
  
  *(undefined1 *)(in_RDI + 19000) = 0;
  *(undefined1 *)(in_RDI + 0x4a39) = 0;
  *(undefined1 *)(in_RDI + 0x4a3a) = 0;
  av1_clearall_segfeatures((segmentation *)0x2fb4dd);
  return;
}

Assistant:

void av1_reset_segment_features(AV1_COMMON *cm) {
  struct segmentation *seg = &cm->seg;

  // Set up default state for MB feature flags
  seg->enabled = 0;
  seg->update_map = 0;
  seg->update_data = 0;
  av1_clearall_segfeatures(seg);
}